

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O2

void __thiscall ChaCha20Aligned::SetKey(ChaCha20Aligned *this,Span<const_std::byte> key)

{
  long lVar1;
  byte *pbVar2;
  long in_FS_OFFSET;
  
  pbVar2 = key.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (key.m_size != 0x20) {
    __assert_fail("key.size() == KEYLEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x1b,"void ChaCha20Aligned::SetKey(Span<const std::byte>)");
  }
  this->input[0] = *(undefined4 *)pbVar2;
  this->input[1] = *(undefined4 *)(pbVar2 + 4);
  this->input[2] = *(undefined4 *)(pbVar2 + 8);
  this->input[3] = *(undefined4 *)(pbVar2 + 0xc);
  this->input[4] = *(undefined4 *)(pbVar2 + 0x10);
  this->input[5] = *(undefined4 *)(pbVar2 + 0x14);
  this->input[6] = *(undefined4 *)(pbVar2 + 0x18);
  this->input[7] = *(undefined4 *)(pbVar2 + 0x1c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    this->input[8] = 0;
    this->input[9] = 0;
    this->input[10] = 0;
    this->input[0xb] = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChaCha20Aligned::SetKey(Span<const std::byte> key) noexcept
{
    assert(key.size() == KEYLEN);
    input[0] = ReadLE32(UCharCast(key.data() + 0));
    input[1] = ReadLE32(UCharCast(key.data() + 4));
    input[2] = ReadLE32(UCharCast(key.data() + 8));
    input[3] = ReadLE32(UCharCast(key.data() + 12));
    input[4] = ReadLE32(UCharCast(key.data() + 16));
    input[5] = ReadLE32(UCharCast(key.data() + 20));
    input[6] = ReadLE32(UCharCast(key.data() + 24));
    input[7] = ReadLE32(UCharCast(key.data() + 28));
    input[8] = 0;
    input[9] = 0;
    input[10] = 0;
    input[11] = 0;
}